

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

float __thiscall
notch::core::SoftmaxWithLoss::output(SoftmaxWithLoss *this,Array *actual,Array *expected)

{
  float fVar1;
  float *pfVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  _func_int **local_28;
  element_type *peStack_20;
  
  if (this->nSize != actual->_M_size) {
    __assert_fail("nSize == actual.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x7e3,
                  "virtual float notch::SoftmaxWithLoss::output(const Array &, const Array &)");
  }
  if (this->nSize != expected->_M_size) {
    __assert_fail("nSize == expected.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x7e4,
                  "virtual float notch::SoftmaxWithLoss::output(const Array &, const Array &)");
  }
  softmax((SoftmaxWithLoss *)&stack0xffffffffffffffd8,actual);
  pfVar2 = (this->softmaxOutput)._M_data;
  if (pfVar2 != (float *)0x0) {
    operator_delete(pfVar2);
  }
  (this->softmaxOutput)._M_size = (size_t)local_28;
  (this->softmaxOutput)._M_data = (float *)peStack_20;
  local_28 = (_func_int **)0x0;
  peStack_20 = (element_type *)0x0;
  operator_delete((void *)0x0);
  if (this->nSize == 0) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 0.0;
    uVar3 = 0;
    do {
      fVar1 = expected->_M_data[uVar3];
      fVar4 = logf((this->softmaxOutput)._M_data[uVar3]);
      fVar5 = fVar5 - fVar4 * fVar1;
      (this->lossGrad)._M_data[uVar3] =
           expected->_M_data[uVar3] - (this->softmaxOutput)._M_data[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->nSize);
  }
  return fVar5;
}

Assistant:

virtual float output(const Array &actual, const Array &expected) {
        float lossTotal = 0.0;
        assert (nSize == actual.size());
        assert (nSize == expected.size());
        softmaxOutput = softmax(actual);
        for (size_t i = 0; i < nSize; ++i) {
            // accumulate loss across all class labels
            lossTotal -= expected[i] * std::log(softmaxOutput[i]);
            // combination of softmax activation with cross-entropy loss
            // allows to simplify loss gradient calculation:
            //
            // $$ \\grad_y E = d - \\phi(y)$$
            lossGrad[i] = expected[i] - softmaxOutput[i];
        }
        return lossTotal;
    }